

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test::
~DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test
          (DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__DatarateTestSVC_01075ad8;
  *(undefined ***)this = &PTR__DatarateTestSVC_01075cf0;
  *(undefined ***)(this + 8) = &PTR__DatarateTestSVC_01075d10;
  if (*(void **)(this + 0x4c0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x4c0));
  }
  *(undefined ***)(this + 8) = &PTR__EncoderTest_01081d70;
  if (*(DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test **)(this + 0x3b0) != this + 0x3c0)
  {
    operator_delete(*(DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test **)(this + 0x3b0));
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC1TL1SLIntraOnly) {
  BasicRateTargetingSVC1TL1SLIntraOnlyTest();
}